

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O3

void __thiscall
TApp_IncorrectConstructionDuplicateExcludes_Test::TestBody
          (TApp_IncorrectConstructionDuplicateExcludes_Test *this)

{
  bool bVar1;
  Option *this_00;
  Option *opt;
  App *this_01;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  AssertHelper local_a8;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"--cat","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
  this_01 = &(this->super_TApp).app;
  this_00 = CLI::App::add_flag(this_01,&local_40,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"--other","");
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
  opt = CLI::App::add_flag(this_01,&local_80,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      CLI::Option::excludes(this_00,opt);
    }
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      CLI::Option::excludes(this_00,opt);
    }
    testing::Message::Message((Message *)&local_b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xc2,
               "Expected: cat->excludes(other) throws an exception of type CLI::OptionAlreadyAdded.\n  Actual: it throws nothing."
              );
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if (local_b0.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      return;
    }
    bVar1 = testing::internal::IsTrue(true);
  }
  else {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xc1,
               "Expected: cat->excludes(other) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if (local_b0.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      return;
    }
    bVar1 = testing::internal::IsTrue(true);
  }
  if ((bVar1 != false) &&
     (local_b0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_b0.ptr_ + 8))();
  }
  return;
}

Assistant:

TEST_F(TApp, IncorrectConstructionDuplicateExcludes) {
    auto cat = app.add_flag("--cat");
    auto other = app.add_flag("--other");
    ASSERT_NO_THROW(cat->excludes(other));
    EXPECT_THROW(cat->excludes(other), CLI::OptionAlreadyAdded);
}